

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CsvConsumer(char *zToken,int nTokenLen,void *pUserData)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  ushort **ppuVar4;
  uint uVar5;
  byte bVar6;
  ulong uVar7;
  jx9_value sEntry;
  SyString local_80;
  jx9_value local_70;
  
  if (nTokenLen != 0) {
    bVar6 = *zToken;
    uVar3 = nTokenLen;
    local_80.zString = zToken;
    if (bVar6 < 0xc0) {
      pbVar1 = (byte *)(zToken + 1);
      uVar5 = nTokenLen;
      uVar2 = nTokenLen - 1;
      local_80.nByte = nTokenLen;
      do {
        nTokenLen = uVar2;
        zToken = (char *)pbVar1;
        if ((bVar6 != 0) &&
           (ppuVar4 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar4 + (long)(char)bVar6 * 2 + 1) & 0x20) == 0)) {
          zToken = (char *)((byte *)zToken + -1);
          uVar3 = nTokenLen + 1;
          nTokenLen = uVar5;
          break;
        }
        if (nTokenLen == 0) {
          return 0;
        }
        bVar6 = *zToken;
        pbVar1 = (byte *)zToken + 1;
        uVar5 = nTokenLen;
        uVar2 = nTokenLen - 1;
        uVar3 = nTokenLen;
        local_80.zString = zToken;
      } while (bVar6 < 0xc0);
    }
    bVar6 = ((byte *)zToken)[uVar3 - 1];
    if (bVar6 < 0xc0) {
      uVar7 = (ulong)uVar3 - 2;
      local_80.nByte = nTokenLen;
      do {
        uVar3 = uVar3 - 1;
        if ((bVar6 != 0) &&
           (ppuVar4 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar4 + (long)(char)bVar6 * 2 + 1) & 0x20) == 0)) break;
        if (uVar3 == 0) {
          return 0;
        }
        bVar6 = ((byte *)zToken)[uVar7 & 0xffffffff];
        uVar7 = uVar7 - 1;
        nTokenLen = uVar3;
      } while (bVar6 < 0xc0);
    }
    local_80.nByte = nTokenLen;
    jx9MemObjInitFromString(*(jx9_vm **)((long)pUserData + 0x10),&local_70,&local_80);
    if ((*(byte *)((long)pUserData + 8) & 0x40) != 0) {
      HashmapInsert(*pUserData,(jx9_value *)0x0,&local_70);
    }
    jx9MemObjRelease(&local_70);
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9CsvConsumer(const char *zToken, int nTokenLen, void *pUserData)
{
	jx9_value *pArray = (jx9_value *)pUserData;
	jx9_value sEntry;
	SyString sToken;
	/* Insert the token in the given array */
	SyStringInitFromBuf(&sToken, zToken, nTokenLen);
	/* Remove trailing and leading white spcaces and null bytes */
	SyStringFullTrimSafe(&sToken);
	if( sToken.nByte < 1){
		return SXRET_OK;
	}
	jx9MemObjInitFromString(pArray->pVm, &sEntry, &sToken);
	jx9_array_add_elem(pArray, 0, &sEntry);
	jx9MemObjRelease(&sEntry);
	return SXRET_OK;
}